

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_isdir.cxx
# Opt level: O1

int fl_filename_isdir(char *n)

{
  int iVar1;
  size_t sVar2;
  char *f;
  ulong __n;
  stat s;
  char fn [2048];
  stat sStack_8a8;
  char local_818 [2048];
  
  sVar2 = strlen(n);
  f = n;
  if ((1 < (int)sVar2) && (__n = (ulong)((int)sVar2 - 1), n[__n] == '/')) {
    f = local_818;
    memcpy(f,n,__n);
    local_818[__n] = '\0';
  }
  iVar1 = fl_stat(f,&sStack_8a8);
  return (int)((sStack_8a8.st_mode & 0xf000) == 0x4000 && iVar1 == 0);
}

Assistant:

int fl_filename_isdir(const char* n) {
  struct stat	s;
  char		fn[FL_PATH_MAX];
  int		length;

  length = (int) strlen(n);

#ifdef WIN32
  // This workaround brought to you by the fine folks at Microsoft!
  // (read lots of sarcasm in that...)
  if (length < (int)(sizeof(fn) - 1)) {
    if (length < 4 && isalpha(n[0]) && n[1] == ':' &&
        (isdirsep(n[2]) || !n[2])) {
      // Always use D:/ for drive letters
      fn[0] = n[0];
      strcpy(fn + 1, ":/");
      n = fn;
    } else if (length > 0 && isdirsep(n[length - 1])) {
      // Strip trailing slash from name...
      length --;
      memcpy(fn, n, length);
      fn[length] = '\0';
      n = fn;
    }
  }
#else
  // Matt: Just in case, we strip the slash for other operating
  // systems as well, avoid bugs by sloppy implementations
  // of "stat".
  if (length > 1 && isdirsep(n[length - 1])) {
    length --;
    memcpy(fn, n, length);
    fn[length] = '\0';
    n = fn;
  }
#endif

  return !fl_stat(n, &s) && (s.st_mode&0170000)==0040000;
}